

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

void Id_DsdManTuneStr1(If_DsdMan_t *p,char *pStruct,int nConfls,int fVerbose)

{
  FILE *pFile;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  abctime aVar5;
  Ifn_Ntk_t *p_00;
  char *pcVar6;
  void *pvVar7;
  Vec_Wrd_t *pVVar8;
  ProgressBar *p_01;
  If_DsdObj_t *pObj_00;
  word *pTruth_00;
  word *pConfig_00;
  abctime aVar9;
  Ifn_Ntk_t *pNtk;
  abctime clk;
  int LutSize;
  int Value;
  int nVars;
  int i;
  word *pConfig;
  word *pTruth;
  If_DsdObj_t *pObj;
  ProgressBar *pProgress;
  int fVeryVerbose;
  int fVerbose_local;
  int nConfls_local;
  char *pStruct_local;
  If_DsdMan_t *p_local;
  
  aVar5 = Abc_Clock();
  p_00 = Ifn_NtkParse(pStruct);
  if (p_00 != (Ifn_Ntk_t *)0x0) {
    iVar1 = If_DsdManVarNum(p);
    iVar2 = Ifn_NtkInputNum(p_00);
    if (iVar2 < iVar1) {
      uVar3 = If_DsdManVarNum(p);
      uVar4 = Ifn_NtkInputNum(p_00);
      printf("The support of DSD manager (%d) exceeds the support of the structure (%d).\n",
             (ulong)uVar3,(ulong)uVar4);
      if (p_00 != (Ifn_Ntk_t *)0x0) {
        free(p_00);
      }
    }
    else {
      if (p->pCellStr != (char *)0x0) {
        free(p->pCellStr);
        p->pCellStr = (char *)0x0;
      }
      pcVar6 = Abc_UtilStrsav(pStruct);
      p->pCellStr = pcVar6;
      iVar1 = If_DsdManVarNum(p);
      iVar2 = Ifn_NtkInputNum(p_00);
      if (iVar1 < iVar2) {
        uVar3 = If_DsdManVarNum(p);
        uVar4 = Ifn_NtkInputNum(p_00);
        printf("Warning: The support of DSD manager (%d) is less than the support of the structure (%d).\n"
               ,(ulong)uVar3,(ulong)uVar4);
      }
      uVar3 = Ifn_NtkLutSizeMax(p_00);
      iVar1 = Ifn_NtkTtBits(pStruct);
      p->nTtBits = iVar1;
      iVar1 = Abc_Bit6WordNum(p->nTtBits);
      p->nConfigWords = iVar1 + 1;
      if (fVerbose != 0) {
        printf("Considering programmable cell: ");
        Ifn_NtkPrint(p_00);
        printf("Largest LUT size = %d.\n",(ulong)uVar3);
      }
      if (0 < p->nObjsPrev) {
        uVar3 = p->nObjsPrev;
        uVar4 = Vec_PtrSize(&p->vObjs);
        printf("Starting the tuning process from object %d (out of %d).\n",(ulong)uVar3,(ulong)uVar4
              );
      }
      for (Value = 0; iVar1 = Vec_PtrSize(&p->vObjs), Value < iVar1; Value = Value + 1) {
        pvVar7 = Vec_PtrEntry(&p->vObjs,Value);
        if (p->nObjsPrev <= Value) {
          *(uint *)((long)pvVar7 + 4) = *(uint *)((long)pvVar7 + 4) & 0xfffffeff;
        }
      }
      if (p->vConfigs == (Vec_Wrd_t *)0x0) {
        iVar1 = p->nConfigWords;
        iVar2 = Vec_PtrSize(&p->vObjs);
        pVVar8 = Vec_WrdStart(iVar1 * iVar2);
        p->vConfigs = pVVar8;
      }
      else {
        pVVar8 = p->vConfigs;
        iVar1 = p->nConfigWords;
        iVar2 = Vec_PtrSize(&p->vObjs);
        Vec_WrdFillExtra(pVVar8,iVar1 * iVar2,0);
      }
      pFile = _stdout;
      iVar1 = Vec_PtrSize(&p->vObjs);
      p_01 = Extra_ProgressBarStart(pFile,iVar1);
      for (Value = p->nObjsPrev; iVar1 = Vec_PtrSize(&p->vObjs), Value < iVar1; Value = Value + 1) {
        pObj_00 = (If_DsdObj_t *)Vec_PtrEntry(&p->vObjs,Value);
        if ((Value & 0xffU) == 0) {
          Extra_ProgressBarUpdate(p_01,Value,(char *)0x0);
        }
        uVar3 = If_DsdObjSuppSize(pObj_00);
        iVar1 = Abc_Var2Lit(Value,0);
        pTruth_00 = If_DsdManComputeTruth(p,iVar1,(uchar *)0x0);
        if (fVerbose != 0) {
          printf("%6d : %2d ",(ulong)(uint)Value,(ulong)uVar3);
        }
        pConfig_00 = Vec_WrdEntryP(p->vConfigs,p->nConfigWords * Value);
        iVar1 = Ifn_NtkMatch(p_00,pTruth_00,uVar3,nConfls,fVerbose,0,pConfig_00);
        if (iVar1 == 0) {
          If_DsdVecObjSetMark(&p->vObjs,Value);
          memset(pConfig_00,0,(long)p->nConfigWords << 3);
        }
      }
      p->nObjsPrev = 0;
      p->LutSize = 0;
      Extra_ProgressBarStop(p_01);
      uVar3 = Vec_PtrSize(&p->vObjs);
      printf("Finished matching %d functions. ",(ulong)uVar3);
      aVar9 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar9 - aVar5);
      if (p_00 != (Ifn_Ntk_t *)0x0) {
        free(p_00);
      }
    }
  }
  return;
}

Assistant:

void Id_DsdManTuneStr1( If_DsdMan_t * p, char * pStruct, int nConfls, int fVerbose )
{
    int fVeryVerbose = 0;
    ProgressBar * pProgress = NULL;
    If_DsdObj_t * pObj;
    word * pTruth, * pConfig;
    int i, nVars, Value, LutSize;
    abctime clk = Abc_Clock();
    // parse the structure
    Ifn_Ntk_t * pNtk = Ifn_NtkParse( pStruct );
    if ( pNtk == NULL )
        return;
    if ( If_DsdManVarNum(p) > Ifn_NtkInputNum(pNtk) )
    {
        printf( "The support of DSD manager (%d) exceeds the support of the structure (%d).\n", If_DsdManVarNum(p), Ifn_NtkInputNum(pNtk) );
        ABC_FREE( pNtk );
        return;
    }
    ABC_FREE( p->pCellStr );
    p->pCellStr = Abc_UtilStrsav( pStruct );
    if ( If_DsdManVarNum(p) < Ifn_NtkInputNum(pNtk) )
        printf( "Warning: The support of DSD manager (%d) is less than the support of the structure (%d).\n", If_DsdManVarNum(p), Ifn_NtkInputNum(pNtk) );
    LutSize = Ifn_NtkLutSizeMax(pNtk);
    p->nTtBits = Ifn_NtkTtBits( pStruct );
    p->nConfigWords = 1 + Abc_Bit6WordNum( p->nTtBits );
    // print
    if ( fVerbose )
    {
        printf( "Considering programmable cell: " );
        Ifn_NtkPrint( pNtk );
        printf( "Largest LUT size = %d.\n", LutSize );
    }
    if ( p->nObjsPrev > 0 )
        printf( "Starting the tuning process from object %d (out of %d).\n", p->nObjsPrev, Vec_PtrSize(&p->vObjs) );
    // clean the attributes
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
        if ( i >= p->nObjsPrev )
            pObj->fMark = 0;
    if ( p->vConfigs == NULL )
        p->vConfigs = Vec_WrdStart( p->nConfigWords * Vec_PtrSize(&p->vObjs) );
    else
        Vec_WrdFillExtra( p->vConfigs, p->nConfigWords * Vec_PtrSize(&p->vObjs), 0 );
    pProgress = Extra_ProgressBarStart( stdout, Vec_PtrSize(&p->vObjs) );
    If_DsdVecForEachObjStart( &p->vObjs, pObj, i, p->nObjsPrev )
    {
        if ( (i & 0xFF) == 0 )
            Extra_ProgressBarUpdate( pProgress, i, NULL );
        nVars = If_DsdObjSuppSize(pObj);
        //if ( nVars <= LutSize )
        //    continue;
        pTruth = If_DsdManComputeTruth( p, Abc_Var2Lit(i, 0), NULL );
        if ( fVeryVerbose )
            Dau_DsdPrintFromTruth( pTruth, nVars );
        if ( fVerbose )
            printf( "%6d : %2d ", i, nVars );
        pConfig = Vec_WrdEntryP( p->vConfigs, p->nConfigWords * i );
        Value = Ifn_NtkMatch( pNtk, pTruth, nVars, nConfls, fVerbose, fVeryVerbose, pConfig );
        if ( fVeryVerbose )
            printf( "\n" );
        if ( Value == 0 )
        {
            If_DsdVecObjSetMark( &p->vObjs, i );
            memset( pConfig, 0, sizeof(word) * p->nConfigWords );
        }
    }
    p->nObjsPrev = 0;
    p->LutSize = 0;
    Extra_ProgressBarStop( pProgress );
    printf( "Finished matching %d functions. ", Vec_PtrSize(&p->vObjs) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVeryVerbose )
        If_DsdManPrintDistrib( p );
    ABC_FREE( pNtk );
}